

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::IssueMessage(cmMakefile *this,MessageType t,string *text)

{
  pointer ppcVar1;
  
  if (((t & ~AUTHOR_ERROR) == FATAL_ERROR) &&
     (ppcVar1 = (this->ExecutionStatusStack).
                super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>.
                _M_impl.super__Vector_impl_data._M_finish,
     (this->ExecutionStatusStack).
     super__Vector_base<cmExecutionStatus_*,_std::allocator<cmExecutionStatus_*>_>._M_impl.
     super__Vector_impl_data._M_start != ppcVar1)) {
    ppcVar1[-1]->NestedError = true;
  }
  cmake::IssueMessage(this->GlobalGenerator->CMakeInstance,t,text,&this->Backtrace);
  return;
}

Assistant:

void cmMakefile::IssueMessage(MessageType t, std::string const& text) const
{
  if (!this->ExecutionStatusStack.empty()) {
    if ((t == MessageType::FATAL_ERROR) ||
        (t == MessageType::INTERNAL_ERROR)) {
      this->ExecutionStatusStack.back()->SetNestedError();
    }
  }
  this->GetCMakeInstance()->IssueMessage(t, text, this->Backtrace);
}